

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  unsigned_short *puVar5;
  int *piVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uchar *puVar16;
  uchar *puVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  size_t sVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uchar *puVar29;
  ulong uVar30;
  ulong uVar31;
  uchar *puVar32;
  ulong uVar33;
  bool bVar34;
  uint local_bc;
  
  uVar9 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar9 = windowsize;
  }
  uVar20 = 0x40;
  if (0x1fff < windowsize) {
    uVar20 = 0x102;
  }
  uVar24 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar14 = windowsize - 1;
    uVar24 = 0x5a;
    if ((windowsize & uVar14) == 0) {
      uVar24 = 0x102;
      if (nicematch < 0x102) {
        uVar24 = nicematch;
      }
      if (inpos < insize) {
        puVar12 = in + insize;
        uVar8 = 0;
        uVar15 = 0;
        bVar7 = false;
        uVar23 = 0;
        do {
          uVar10 = getHash(in,insize,inpos);
          uVar30 = 0;
          if (uVar10 == 0) {
            if (uVar23 == 0) {
              puVar17 = in + inpos + 0x102;
              if (puVar12 < in + inpos + 0x102) {
                puVar17 = puVar12;
              }
              puVar16 = in + inpos;
              puVar32 = puVar16;
              for (puVar29 = puVar16; (puVar29 != puVar17 && (puVar32 = puVar29, *puVar29 == '\0'));
                  puVar29 = puVar29 + 1) {
                puVar32 = puVar17;
              }
              uVar30 = (ulong)(uint)((int)puVar32 - (int)puVar16);
            }
            else {
              if ((insize < uVar23 + inpos) || (in[(uVar23 + inpos) - 1] != '\0')) {
                uVar23 = uVar23 - 1;
              }
              uVar30 = (ulong)uVar23;
            }
          }
          uVar23 = (uint)uVar30;
          uVar26 = (uint)inpos & uVar14;
          uVar31 = (ulong)uVar26;
          piVar3 = hash->val;
          piVar3[uVar31] = uVar10;
          piVar4 = hash->head;
          if (piVar4[uVar10] != -1) {
            hash->chain[uVar31] = (unsigned_short)piVar4[uVar10];
          }
          piVar4[uVar10] = uVar26;
          puVar5 = hash->zeros;
          puVar5[uVar31] = (unsigned_short)uVar30;
          piVar6 = hash->headz;
          if (piVar6[uVar30 & 0xffff] != -1) {
            hash->chainz[uVar31] = (unsigned_short)piVar6[uVar30 & 0xffff];
          }
          uVar13 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar13 = insize;
          }
          piVar6[uVar30 & 0xffff] = uVar26;
          if (uVar9 == 0) {
            local_bc = 0;
            uVar26 = 0;
          }
          else {
            puVar17 = in + inpos;
            uVar26 = 0;
            local_bc = 0;
            uVar18 = 0;
            uVar19 = (ulong)hash->chain[uVar31];
            uVar11 = 1;
            do {
              uVar25 = 0;
              if (uVar31 < uVar19) {
                uVar25 = (ulong)windowsize;
              }
              uVar25 = (uVar31 - uVar19) + uVar25;
              uVar21 = (uint)uVar25;
              if (uVar21 < (uint)uVar18) break;
              if (uVar25 != 0) {
                puVar32 = in + (inpos - (uVar25 & 0xffffffff));
                puVar29 = puVar17;
                if (2 < uVar23) {
                  uVar18 = (ulong)(uint)puVar5[uVar19];
                  if (uVar23 < puVar5[uVar19]) {
                    uVar18 = uVar30;
                  }
                  puVar32 = puVar32 + uVar18;
                  puVar29 = puVar17 + uVar18;
                }
                iVar27 = (int)(in + uVar13);
                for (; puVar29 != in + uVar13; puVar29 = puVar29 + 1) {
                  if (*puVar32 != *puVar29) {
                    iVar27 = (int)puVar29;
                    break;
                  }
                  puVar32 = puVar32 + 1;
                }
                uVar28 = iVar27 - (int)puVar17;
                if ((uVar26 < uVar28) && (uVar26 = uVar28, local_bc = uVar21, uVar24 <= uVar28))
                break;
              }
              uVar2 = hash->chain[uVar19];
              uVar33 = (ulong)uVar2;
              if ((ushort)uVar19 == uVar2) break;
              if ((uVar23 < 3) || (uVar26 <= uVar23)) {
                if (piVar3[uVar2] != uVar10) break;
              }
              else {
                uVar33 = (ulong)hash->chainz[uVar19];
                if (uVar23 != puVar5[uVar33]) break;
              }
              bVar34 = uVar11 != uVar9;
              uVar18 = uVar25;
              uVar19 = uVar33;
              uVar11 = uVar11 + 1;
            } while (bVar34);
          }
          bVar34 = bVar7;
          if (lazymatching == 0) {
LAB_001ade50:
            if ((2 < uVar26) && (windowsize < local_bc)) {
              return 0x56;
            }
            bVar7 = bVar34;
            if (((uVar26 < 3) || (uVar26 < minmatch)) || ((uVar26 == 3 && (0x1000 < local_bc)))) {
              bVar1 = in[inpos];
              uVar10 = uivector_resize(out,out->size + 1);
              if (uVar10 == 0) {
                return 0x53;
              }
              out->data[out->size - 1] = (uint)bVar1;
            }
            else {
              uVar13 = 1;
              uVar31 = 0x1c;
              do {
                uVar18 = uVar13 + uVar31 >> 1;
                if (uVar26 < LENGTHBASE[uVar18]) {
                  uVar31 = uVar18 - 1;
                  if (*(uint *)(&UNK_0023f1cc + uVar18 * 4) <= uVar26) goto LAB_001adf0c;
                }
                else {
                  uVar13 = uVar18 + 1;
                }
              } while (uVar13 <= uVar31);
              uVar31 = 0x1c;
LAB_001adf0c:
              uVar23 = LENGTHBASE[uVar31 & 0xffffffff];
              uVar18 = 1;
              uVar13 = 0x1d;
              do {
                uVar19 = uVar18 + uVar13 >> 1;
                if (local_bc < DISTANCEBASE[uVar19]) {
                  uVar13 = uVar19 - 1;
                  if (*(uint *)(&UNK_0023f2cc + uVar19 * 4) <= local_bc) goto LAB_001adf4a;
                }
                else {
                  uVar18 = uVar19 + 1;
                }
              } while (uVar18 <= uVar13);
              uVar13 = 0x1d;
LAB_001adf4a:
              uVar10 = DISTANCEBASE[uVar13 & 0xffffffff];
              uVar11 = uivector_resize(out,out->size + 1);
              sVar22 = out->size;
              if (uVar11 != 0) {
                out->data[sVar22 - 1] = (int)uVar31 + 0x101;
              }
              uVar11 = uivector_resize(out,sVar22 + 1);
              sVar22 = out->size;
              if (uVar11 != 0) {
                out->data[sVar22 - 1] = uVar26 - uVar23;
              }
              uVar23 = uivector_resize(out,sVar22 + 1);
              sVar22 = out->size;
              if (uVar23 != 0) {
                out->data[sVar22 - 1] = (uint)uVar13;
              }
              uVar23 = uivector_resize(out,sVar22 + 1);
              if (uVar23 != 0) {
                out->data[out->size - 1] = local_bc - uVar10;
              }
              piVar3 = hash->head;
              piVar4 = hash->val;
              puVar5 = hash->zeros;
              piVar6 = hash->headz;
              uVar10 = 1;
              sVar22 = inpos;
              do {
                inpos = sVar22 + 1;
                uVar11 = getHash(in,insize,inpos);
                uVar31 = 0;
                if (uVar11 == 0) {
                  if ((int)uVar30 == 0) {
                    puVar17 = in + sVar22 + 0x103;
                    if (puVar12 < in + sVar22 + 0x103) {
                      puVar17 = puVar12;
                    }
                    puVar29 = in + inpos;
                    puVar16 = puVar29;
                    for (puVar32 = puVar29;
                        (puVar32 != puVar17 && (puVar16 = puVar32, *puVar32 == '\0'));
                        puVar32 = puVar32 + 1) {
                      puVar16 = puVar17;
                    }
                    uVar31 = (ulong)(uint)((int)puVar16 - (int)puVar29);
                  }
                  else if ((insize < uVar30 + inpos) ||
                          (uVar31 = uVar30, in[uVar30 + sVar22] != '\0')) {
                    uVar31 = (ulong)((int)uVar30 - 1);
                  }
                }
                uVar23 = (uint)uVar31;
                uVar21 = (uint)inpos & uVar14;
                piVar4[uVar21] = uVar11;
                iVar27 = piVar3[uVar11];
                if (iVar27 != -1) {
                  hash->chain[uVar21] = (unsigned_short)iVar27;
                }
                piVar3[uVar11] = uVar21;
                puVar5[uVar21] = (unsigned_short)uVar31;
                iVar27 = piVar6[uVar31 & 0xffff];
                if (iVar27 != -1) {
                  hash->chainz[uVar21] = (unsigned_short)iVar27;
                }
                piVar6[uVar31 & 0xffff] = uVar21;
                uVar10 = uVar10 + 1;
                sVar22 = inpos;
                uVar30 = uVar31;
              } while (uVar10 != uVar26);
            }
          }
          else {
            if ((bVar7) || (uVar26 < 3)) {
              bVar34 = false;
              if (bVar7) {
                if (inpos == 0) {
                  return 0x51;
                }
                if (uVar15 + 1 < uVar26) {
                  bVar1 = in[inpos - 1];
                  uVar10 = uivector_resize(out,out->size + 1);
                  if (uVar10 == 0) {
                    return 0x53;
                  }
                  out->data[out->size - 1] = (uint)bVar1;
                  bVar34 = false;
                }
                else {
                  piVar4[uVar10] = -1;
                  piVar6[uVar30] = -1;
                  inpos = inpos - 1;
                  local_bc = uVar8;
                  uVar26 = uVar15;
                  bVar34 = false;
                }
              }
              goto LAB_001ade50;
            }
            bVar34 = false;
            if (uVar20 < uVar26 || 0x101 < uVar26) goto LAB_001ade50;
            bVar7 = true;
            uVar15 = uVar26;
            uVar8 = local_bc;
          }
          inpos = inpos + 1;
        } while (inpos < insize);
      }
      uVar24 = 0;
    }
  }
  return uVar24;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}